

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O2

void ryg_dxt::PrepareOptTable3(sU8 *Table,sU8 *expand,sInt size)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  sInt max;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  sInt min;
  ulong uVar8;
  int iVar9;
  
  lVar2 = 0;
  uVar3 = 0;
  if (0 < size) {
    uVar3 = (ulong)(uint)size;
  }
  for (; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    iVar9 = 0x100;
    for (uVar8 = 0; uVar8 != uVar3; uVar8 = uVar8 + 1) {
      for (uVar4 = 0; (uint)size != uVar4; uVar4 = uVar4 + 1) {
        iVar6 = ((uint)expand[uVar4] + (uint)expand[uVar8] >> 1) - (int)lVar2;
        iVar7 = -iVar6;
        if (0 < iVar6) {
          iVar7 = iVar6;
        }
        iVar6 = (uint)expand[uVar4] - (uint)expand[uVar8];
        bVar1 = (byte)iVar6;
        bVar5 = -bVar1;
        if (0 < iVar6) {
          bVar5 = bVar1;
        }
        iVar7 = (uint)(bVar5 >> 5) + iVar7;
        if (iVar7 < iVar9) {
          Table[lVar2 * 2] = (sU8)uVar4;
          Table[lVar2 * 2 + 1] = (sU8)uVar8;
          iVar9 = iVar7;
        }
      }
    }
  }
  return;
}

Assistant:

static void PrepareOptTable3(sU8* Table, const sU8* expand, sInt size) {
  for (sInt i = 0; i < 256; i++) {
    sInt bestErr = 256;

    for (sInt min = 0; min < size; min++) {
      for (sInt max = 0; max < size; max++) {
        sInt mine = expand[min];
        sInt maxe = expand[max];
        sInt err = sAbs(((mine + maxe) >> 1) - i);
        err += ((sAbs(maxe - mine) * 8) >> 8);  // approx. .03f

        if (err < bestErr) {
          Table[i * 2 + 0] = max;
          Table[i * 2 + 1] = min;
          bestErr = err;
        }
      }
    }
  }
}